

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::FormulasLoader::isFunction(FormulasLoader *this,Operator op)

{
  return op - POW < 0x26;
}

Assistant:

bool FormulasLoader::isFunction( Operator op )
	{
		switch ( op )
		{
		case POW:
		case FACTORIAL:
		case ABS:
		case EXP:
		case LN:
		case MIN:
		case MAX:
		case CEIL:
		case FLOOR:
		case GCD:
		case LCM:
		case REM:
		case ROOT:
		case LOG:
		case SIN:
		case COS:
		case TAN:
		case SEC:
		case CSC:
		case COT:
		case ARCSIN:
		case ARCCOS:
		case ARCTAN:
		case ARCSEC:
		case ARCCSC:
		case ARCCOT:
		case SINH:
		case COSH:
		case TANH:
		case SECH:
		case CSCH:
		case COTH:
		case ARCSINH:
		case ARCCOSH:
		case ARCTANH:
		case ARCCOTH:
		case ARCSECH:
		case ARCCSCH:
			return true;
		default:
			return false;
		}
	}